

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_rw_hd(Curl_easy *data,char *hd,size_t hdlen,char *buf_remain,size_t blen,
                   size_t *pconsumed)

{
  bool bVar1;
  CURLcode CVar2;
  int iVar3;
  statusline sVar4;
  char *pcVar5;
  size_t last_hd_len;
  bool bVar6;
  char *local_a0;
  char *p_1;
  char *pcStack_90;
  statusline check;
  char *p;
  size_t sStack_80;
  _Bool fine_statusline;
  size_t consumed;
  dynbuf last_header;
  int writetype;
  SingleRequest *k;
  CURLcode result;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_remain_local;
  size_t hdlen_local;
  char *hd_local;
  Curl_easy *data_local;
  
  *pconsumed = 0;
  if ((*hd == '\n') || (*hd == '\r')) {
    Curl_dyn_init((dynbuf *)&consumed,hdlen + 1);
    CVar2 = Curl_dyn_addn((dynbuf *)&consumed,hd,hdlen);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    Curl_dyn_reset(&(data->state).headerb);
    pcVar5 = Curl_dyn_ptr((dynbuf *)&consumed);
    last_hd_len = Curl_dyn_len((dynbuf *)&consumed);
    CVar2 = http_on_response(data,pcVar5,last_hd_len,buf_remain,blen,&stack0xffffffffffffff80);
    *pconsumed = sStack_80 + *pconsumed;
    Curl_dyn_free((dynbuf *)&consumed);
    return CVar2;
  }
  last_header.toobig._4_4_ = 4;
  iVar3 = (data->req).headerline;
  (data->req).headerline = iVar3 + 1;
  if (iVar3 == 0) {
    bVar1 = false;
    (data->req).httpversion = 0;
    pcStack_90 = hd;
    if ((data->conn->handler->protocol & 0xc0000003) == 0) {
      local_a0 = hd;
      if ((data->conn->handler->protocol & 0x40000) != 0) {
        while( true ) {
          bVar6 = false;
          if ((*local_a0 != '\0') && (bVar6 = true, *local_a0 != ' ')) {
            bVar6 = *local_a0 == '\t';
          }
          if (!bVar6) break;
          local_a0 = local_a0 + 1;
        }
        iVar3 = strncmp(local_a0,"RTSP/",5);
        if (iVar3 == 0) {
          if ((((('/' < local_a0[5]) && (local_a0[5] < ':')) && (local_a0[6] == '.')) &&
              (('/' < local_a0[7] && (local_a0[7] < ':')))) &&
             ((((local_a0[8] == ' ' || (local_a0[8] == '\t')) &&
               (((pcVar5 = local_a0 + 9, '/' < *pcVar5 && (*pcVar5 < ':')) && ('/' < local_a0[10])))
               ) && (((local_a0[10] < ':' && ('/' < local_a0[0xb])) && (local_a0[0xb] < ':')))))) {
            (data->req).httpcode =
                 (*pcVar5 + -0x30) * 100 + (local_a0[10] + -0x30) * 10 + local_a0[0xb] + -0x30;
            local_a0 = local_a0 + 0xc;
            if (((*local_a0 == ' ') || (*local_a0 == '\t')) ||
               (('\t' < *local_a0 && (*local_a0 < '\x0e')))) {
              bVar1 = true;
              (data->req).httpversion = 0xb;
            }
          }
          if (!bVar1) {
            return CURLE_WEIRD_SERVER_REPLY;
          }
        }
      }
    }
    else {
      while( true ) {
        bVar6 = false;
        if ((*pcStack_90 != '\0') && (bVar6 = true, *pcStack_90 != ' ')) {
          bVar6 = *pcStack_90 == '\t';
        }
        if (!bVar6) break;
        pcStack_90 = pcStack_90 + 1;
      }
      iVar3 = strncmp(pcStack_90,"HTTP/",5);
      if (iVar3 == 0) {
        iVar3 = (int)pcStack_90[5];
        if (iVar3 == 0x31) {
          if (((pcStack_90[6] == '.') && ((pcStack_90[7] == '0' || (pcStack_90[7] == '1')))) &&
             ((pcStack_90[8] == ' ' || (pcStack_90[8] == '\t')))) {
            (data->req).httpversion = pcStack_90[7] + -0x26;
            pcVar5 = pcStack_90 + 9;
            if (((('/' < *pcVar5) && (*pcVar5 < ':')) && ('/' < pcStack_90[10])) &&
               (((pcStack_90[10] < ':' && ('/' < pcStack_90[0xb])) && (pcStack_90[0xb] < ':')))) {
              (data->req).httpcode =
                   (*pcVar5 + -0x30) * 100 + (pcStack_90[10] + -0x30) * 10 + pcStack_90[0xb] + -0x30
              ;
              pcStack_90 = pcStack_90 + 0xc;
              if (((*pcStack_90 == ' ') || (*pcStack_90 == '\t')) ||
                 (('\t' < *pcStack_90 && (*pcStack_90 < '\x0e')))) {
                bVar1 = true;
              }
            }
          }
          if (!bVar1) {
            Curl_failf(data,"Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
        else {
          if (1 < iVar3 - 0x32U) {
            Curl_failf(data,"Unsupported HTTP version in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          if ((pcStack_90[6] == ' ') || (pcStack_90[6] == '\t')) {
            (data->req).httpversion = (pcStack_90[5] + -0x30) * 10;
            pcVar5 = pcStack_90 + 7;
            if (('/' < *pcVar5) &&
               ((((*pcVar5 < ':' && ('/' < pcStack_90[8])) && (pcStack_90[8] < ':')) &&
                (('/' < pcStack_90[9] && (pcStack_90[9] < ':')))))) {
              (data->req).httpcode =
                   (*pcVar5 + -0x30) * 100 + (pcStack_90[8] + -0x30) * 10 + pcStack_90[9] + -0x30;
              pcStack_90 = pcStack_90 + 10;
              if ((*pcStack_90 == ' ') ||
                 ((*pcStack_90 == '\t' || (('\t' < *pcStack_90 && (*pcStack_90 < '\x0e')))))) {
                bVar1 = true;
              }
            }
          }
        }
      }
      if ((!bVar1) && (sVar4 = checkhttpprefix(data,hd,hdlen), sVar4 == STATUS_DONE)) {
        bVar1 = true;
        (data->req).httpcode = 200;
        (data->req).httpversion = 10;
      }
    }
    if (!bVar1) {
      *(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffffe;
      return CURLE_WEIRD_SERVER_REPLY;
    }
    CVar2 = Curl_http_statusline(data,data->conn);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    last_header.toobig._4_4_ = last_header.toobig._4_4_ | 8;
  }
  data_local._4_4_ = verify_header(data,hd,hdlen);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = Curl_http_header(data,hd,hdlen), data_local._4_4_ == CURLE_OK)) {
    Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
    if ((data->req).httpcode / 100 == 1) {
      last_header.toobig._4_4_ = last_header.toobig._4_4_ | 0x20;
    }
    data_local._4_4_ = Curl_client_write(data,last_header.toobig._4_4_,hd,hdlen);
    if ((data_local._4_4_ == CURLE_OK) &&
       (data_local._4_4_ = Curl_bump_headersize(data,hdlen,false), data_local._4_4_ == CURLE_OK)) {
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode http_rw_hd(struct Curl_easy *data,
                           const char *hd, size_t hdlen,
                           const char *buf_remain, size_t blen,
                           size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int writetype;

  *pconsumed = 0;
  if((0x0a == *hd) || (0x0d == *hd)) {
    /* Empty header line means end of headers! */
    struct dynbuf last_header;
    size_t consumed;

    Curl_dyn_init(&last_header, hdlen + 1);
    result = Curl_dyn_addn(&last_header, hd, hdlen);
    if(result)
      return result;

    /* analyze the response to find out what to do. */
    /* Caveat: we clear anything in the header brigade, because a
     * response might switch HTTP version which may call use recursively.
     * Not nice, but that is currently the way of things. */
    Curl_dyn_reset(&data->state.headerb);
    result = http_on_response(data, Curl_dyn_ptr(&last_header),
                              Curl_dyn_len(&last_header),
                              buf_remain, blen, &consumed);
    *pconsumed += consumed;
    Curl_dyn_free(&last_header);
    return result;
  }

  /*
   * Checks for special headers coming up.
   */

  writetype = CLIENTWRITE_HEADER;
  if(!k->headerline++) {
    /* This is the first header, it MUST be the error code line
       or else we consider this to be the body right away! */
    bool fine_statusline = FALSE;

    k->httpversion = 0; /* Do not know yet */
    if(data->conn->handler->protocol & PROTO_FAMILY_HTTP) {
      /*
       * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
       *
       * The response code is always a three-digit number in HTTP as the spec
       * says. We allow any three-digit number here, but we cannot make
       * guarantees on future behaviors since it is not within the protocol.
       */
      const char *p = hd;

      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "HTTP/", 5)) {
        p += 5;
        switch(*p) {
        case '1':
          p++;
          if((p[0] == '.') && (p[1] == '0' || p[1] == '1')) {
            if(ISBLANK(p[2])) {
              k->httpversion = 10 + (p[1] - '0');
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p))
                  fine_statusline = TRUE;
              }
            }
          }
          if(!fine_statusline) {
            failf(data, "Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        case '2':
        case '3':
          if(!ISBLANK(p[1]))
            break;
          k->httpversion = (*p - '0') * 10;
          p += 2;
          if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
            k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
              (p[2] - '0');
            p += 3;
            if(!ISSPACE(*p))
              break;
            fine_statusline = TRUE;
          }
          break;
        default: /* unsupported */
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }

      if(!fine_statusline) {
        /* If user has set option HTTP200ALIASES,
           compare header line against list of aliases
        */
        statusline check = checkhttpprefix(data, hd, hdlen);
        if(check == STATUS_DONE) {
          fine_statusline = TRUE;
          k->httpcode = 200;
          k->httpversion = 10;
        }
      }
    }
    else if(data->conn->handler->protocol & CURLPROTO_RTSP) {
      const char *p = hd;
      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "RTSP/", 5)) {
        p += 5;
        if(ISDIGIT(*p)) {
          p++;
          if((p[0] == '.') && ISDIGIT(p[1])) {
            if(ISBLANK(p[2])) {
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p)) {
                  fine_statusline = TRUE;
                  k->httpversion = 11; /* RTSP acts like HTTP 1.1 */
                }
              }
            }
          }
        }
        if(!fine_statusline)
          return CURLE_WEIRD_SERVER_REPLY;
      }
    }

    if(fine_statusline) {
      result = Curl_http_statusline(data, data->conn);
      if(result)
        return result;
      writetype |= CLIENTWRITE_STATUS;
    }
    else {
      k->header = FALSE;   /* this is not a header line */
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  result = verify_header(data, hd, hdlen);
  if(result)
    return result;

  result = Curl_http_header(data, hd, hdlen);
  if(result)
    return result;

  /*
   * Taken in one (more) header. Write it to the client.
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  if(k->httpcode/100 == 1)
    writetype |= CLIENTWRITE_1XX;
  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  return CURLE_OK;
}